

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmClientContext::DestroyResInfoObject
          (GmmClientContext *this,GMM_RESOURCE_INFO *pResInfo,
          GmmClientAllocationCallbacks *pAllocCbs)

{
  int iVar1;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  GmmClientAllocationCallbacks *pAllocCbs_local;
  GMM_RESOURCE_INFO *pResInfo_local;
  GmmClientContext *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResInfo != (GMM_RESOURCE_INFO *)0x0) {
    if ((pAllocCbs == (GmmClientAllocationCallbacks *)0x0) ||
       (pAllocCbs->pfnFree == (PFN_ClientFreeFunction)0x0)) {
      (*this->_vptr_GmmClientContext[0x20])(this,pResInfo);
    }
    else {
      iVar1 = (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
      if ((*(ulong *)(CONCAT44(extraout_var,iVar1) + 8) >> 0x29 & 1) == 0) {
        (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[3])();
        (*pAllocCbs->pfnFree)(pAllocCbs->pUserData,pResInfo);
      }
      else {
        GmmResourceInfoLin::GmmResourceInfoLin((GmmResourceInfoLin *)&this_local);
        GmmResourceInfoLin::operator=(pResInfo,(GmmResourceInfoLin *)&this_local);
        GmmResourceInfoLin::~GmmResourceInfoLin((GmmResourceInfoLin *)&this_local);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void GMM_STDCALL GmmLib::GmmClientContext::DestroyResInfoObject(GMM_RESOURCE_INFO *           pResInfo,
                                                                GmmClientAllocationCallbacks *pAllocCbs)
{
    __GMM_ASSERTPTR(pResInfo, VOIDRETURN);

    if(!pAllocCbs || !pAllocCbs->pfnFree)
    {
        return DestroyResInfoObject(pResInfo);
    }
    else
    {
        if(pResInfo->GetResFlags().Info.__PreallocatedResInfo)
        {
            *pResInfo = GmmLib::GmmResourceInfo();
        }
        else
        {
#ifdef _WIN32
            pResInfo->~GmmResourceInfoWin();
#else
            pResInfo->~GmmResourceInfoLin();
#endif
            pAllocCbs->pfnFree(pAllocCbs->pUserData, (void *)pResInfo);
            pResInfo = NULL;
        }
    }
}